

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManSimInfoInit(Gia_ManSim_t *p)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  int local_18;
  int i;
  int iPioNum;
  Gia_ManSim_t *p_local;
  
  for (local_18 = 0; iVar1 = Vec_IntSize(p->vCis2Ids), local_18 < iVar1; local_18 = local_18 + 1) {
    iVar1 = Vec_IntEntry(p->vCis2Ids,local_18);
    iVar2 = Gia_ManPiNum(p->pAig);
    if (iVar1 < iVar2) {
      puVar3 = Gia_SimDataCi(p,local_18);
      Gia_ManSimInfoRandom(p,puVar3);
    }
    else {
      puVar3 = Gia_SimDataCi(p,local_18);
      Gia_ManSimInfoZero(p,puVar3);
    }
  }
  return;
}

Assistant:

void Gia_ManSimInfoInit( Gia_ManSim_t * p )
{
    int iPioNum, i;
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < Gia_ManPiNum(p->pAig) )
            Gia_ManSimInfoRandom( p, Gia_SimDataCi(p, i) );
        else
            Gia_ManSimInfoZero( p, Gia_SimDataCi(p, i) );
    }
}